

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.cpp
# Opt level: O3

Mat4x4 * phyr::_Mat4x4::inverse(Mat4x4 *__return_storage_ptr__,Mat4x4 *mat)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int i;
  long lVar4;
  double (*padVar5) [4];
  double *pdVar6;
  long lVar7;
  double (*padVar8) [4];
  double *pdVar9;
  int j;
  int k;
  long lVar10;
  double dVar11;
  Mat4x4 m;
  
  pdVar6 = (double *)&m;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pdVar6 = *(double *)mat;
    mat = (Mat4x4 *)((long)mat + 8);
    pdVar6 = pdVar6 + 1;
  }
  __return_storage_ptr__->d[3][3] = 1.0;
  __return_storage_ptr__->d[2][2] = 1.0;
  __return_storage_ptr__->d[1][1] = 1.0;
  __return_storage_ptr__->d[0][0] = 1.0;
  __return_storage_ptr__->d[0][1] = 0.0;
  __return_storage_ptr__->d[0][2] = 0.0;
  __return_storage_ptr__->d[0][3] = 0.0;
  __return_storage_ptr__->d[1][0] = 0.0;
  __return_storage_ptr__->d[1][2] = 0.0;
  __return_storage_ptr__->d[1][3] = 0.0;
  __return_storage_ptr__->d[2][0] = 0.0;
  __return_storage_ptr__->d[2][1] = 0.0;
  __return_storage_ptr__->d[2][3] = 0.0;
  __return_storage_ptr__->d[3][0] = 0.0;
  __return_storage_ptr__->d[3][1] = 0.0;
  __return_storage_ptr__->d[3][2] = 0.0;
  lVar4 = 0;
  padVar5 = (double (*) [4])__return_storage_ptr__;
  pdVar6 = (double *)&m;
  do {
    dVar11 = 1.0 / *(double *)((long)m.d + lVar4 * 0x28);
    lVar7 = 0;
    do {
      dVar2 = (pdVar6 + lVar7)[1];
      pdVar6[lVar7] = pdVar6[lVar7] * dVar11;
      (pdVar6 + lVar7)[1] = dVar2 * dVar11;
      pdVar9 = *(double (*) [4])*padVar5 + lVar7;
      dVar2 = pdVar9[1];
      pdVar1 = *(double (*) [4])*padVar5 + lVar7;
      *pdVar1 = *pdVar9 * dVar11;
      pdVar1[1] = dVar2 * dVar11;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 4);
    lVar7 = 0;
    padVar8 = (double (*) [4])__return_storage_ptr__;
    pdVar9 = (double *)&m;
    do {
      if (lVar7 != lVar4) {
        dVar11 = -m.d[lVar7][lVar4];
        lVar10 = 0;
        do {
          dVar2 = (*(double (*) [4])*padVar5)[lVar10];
          dVar3 = (*(double (*) [4])*padVar8)[lVar10];
          pdVar9[lVar10] = pdVar6[lVar10] * dVar11 + pdVar9[lVar10];
          (*(double (*) [4])*padVar8)[lVar10] = dVar2 * dVar11 + dVar3;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
      }
      lVar7 = lVar7 + 1;
      pdVar9 = pdVar9 + 4;
      padVar8 = padVar8 + 1;
    } while (lVar7 != 4);
    lVar4 = lVar4 + 1;
    pdVar6 = pdVar6 + 4;
    padVar5 = padVar5 + 1;
  } while (lVar4 != 4);
  return __return_storage_ptr__;
}

Assistant:

Mat4x4 Mat4x4::inverse(const Mat4x4& mat) {
    Mat4x4 m = mat, inv;

    // Reduce m to identity
    for (int i = 0; i < 4; i++) {
        ASSERT(!isZero(m.d[i][i]));
        // Anchor row is i
        Real coeff = 1.0 / m.d[i][i];
        // Normalize anchor row
        for (int j = 0; j < 4; j++) {
            m.d[i][j] *= coeff;
            // Repeat operation on inverse
            inv.d[i][j] *= coeff;
        }

        // Reduce other rows
        for (int j = 0; j < 4; j++) {
            // Skip anchor row
            if (j == i) continue;
            // For every other row,
            // Apply R[j] = R[j] - C[R[j], i] * R[i]
            Real anc = m.d[j][i];
            for (int k = 0; k < 4; k++) {
                m.d[j][k] -= anc * m.d[i][k];
                // Repeat operation on inverse
                inv.d[j][k] -= anc * inv.d[i][k];
            }
        }
    }

    return inv;
}